

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O0

int Rtm_ManMarkAutoBwd(Rtm_Man_t *pRtm)

{
  int iVar1;
  void *pvVar2;
  Rtm_Obj_t *pObj;
  int local_20;
  int local_1c;
  int Counter;
  int i;
  Rtm_Obj_t *pObjRtm;
  Rtm_Man_t *pRtm_local;
  
  local_20 = 0;
  pvVar2 = Vec_PtrEntry(pRtm->vObjs,0);
  *(uint *)((long)pvVar2 + 8) = *(uint *)((long)pvVar2 + 8) & 0xffffffef | 0x10;
  for (local_1c = 0; iVar1 = Vec_PtrSize(pRtm->vPis), local_1c < iVar1; local_1c = local_1c + 1) {
    pvVar2 = Vec_PtrEntry(pRtm->vPis,local_1c);
    *(uint *)((long)pvVar2 + 8) = *(uint *)((long)pvVar2 + 8) & 0xffffffef | 0x10;
  }
  for (local_1c = 0; iVar1 = Vec_PtrSize(pRtm->vPos), local_1c < iVar1; local_1c = local_1c + 1) {
    pObj = (Rtm_Obj_t *)Vec_PtrEntry(pRtm->vPos,local_1c);
    Rtm_ObjMarkAutoBwd_rec(pObj);
  }
  for (local_1c = 0; iVar1 = Vec_PtrSize(pRtm->vObjs), local_1c < iVar1; local_1c = local_1c + 1) {
    pvVar2 = Vec_PtrEntry(pRtm->vObjs,local_1c);
    *(uint *)((long)pvVar2 + 8) =
         *(uint *)((long)pvVar2 + 8) & 0xffffffef |
         (uint)((*(uint *)((long)pvVar2 + 8) >> 4 & 1) == 0) << 4;
    local_20 = (*(uint *)((long)pvVar2 + 8) >> 4 & 1) + local_20;
  }
  return local_20;
}

Assistant:

int Rtm_ManMarkAutoBwd( Rtm_Man_t * pRtm )
{
    Rtm_Obj_t * pObjRtm;
    int i, Counter = 0;
    // mark nodes reachable from the PIs
    pObjRtm = (Rtm_Obj_t *)Vec_PtrEntry( pRtm->vObjs, 0 );
    pObjRtm->fAuto = 1;
    Rtm_ManForEachPi( pRtm, pObjRtm, i )
        pObjRtm->fAuto = 1;
    Rtm_ManForEachPo( pRtm, pObjRtm, i )
        Rtm_ObjMarkAutoBwd_rec( pObjRtm );
    // count the number of autonomous nodes
    Rtm_ManForEachObj( pRtm, pObjRtm, i )
    {
        pObjRtm->fAuto = !pObjRtm->fAuto;
        Counter += pObjRtm->fAuto;
    }
    // mark the fanins of the autonomous nodes
    return Counter;
}